

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O1

RuleScanRecord * __thiscall
anon_unknown.dwarf_4fe9e4::BuildEngineImpl::newRuleScanRecord(BuildEngineImpl *this)

{
  RuleScanRecord **__x;
  pointer ppRVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  ulong *puVar4;
  RuleScanRecord *pRVar5;
  ulong uVar6;
  
  ppRVar1 = (this->freeRuleScanRecords).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->freeRuleScanRecords).
      super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
      ._M_impl.super__Vector_impl_data._M_start == ppRVar1) {
    __x = &this->currentBlockPos;
    if (this->currentBlockPos == this->currentBlockEnd) {
      uVar2 = this->numScanRecordsPerBlock;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar2;
      uVar6 = 0xffffffffffffffff;
      if (SUB168(auVar3 * ZEXT816(0x30),8) == 0) {
        uVar6 = SUB168(auVar3 * ZEXT816(0x30),0) | 8;
      }
      puVar4 = (ulong *)operator_new__(uVar6);
      *puVar4 = uVar2;
      if (uVar2 != 0) {
        memset((RuleScanRecord *)(puVar4 + 1),0,((uVar2 * 0x30 - 0x30) / 0x30) * 0x30 + 0x30);
      }
      this->currentBlockPos = (RuleScanRecord *)(puVar4 + 1);
      std::
      vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
      ::push_back(&this->ruleScanRecordBlocks,__x);
      this->currentBlockEnd = this->currentBlockPos + this->numScanRecordsPerBlock;
    }
    pRVar5 = *__x;
    *__x = pRVar5 + 1;
  }
  else {
    pRVar5 = ppRVar1[-1];
    (this->freeRuleScanRecords).
    super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppRVar1 + -1;
  }
  return pRVar5;
}

Assistant:

RuleScanRecord* newRuleScanRecord() {
    // If we have an item on the free list, return it.
    if (!freeRuleScanRecords.empty()) {
      auto result = freeRuleScanRecords.back();
      freeRuleScanRecords.pop_back();
      return result;
    }

    // If we are at the end of a block, allocate a new one.
    if (currentBlockPos == currentBlockEnd) {
      currentBlockPos = new RuleScanRecord[numScanRecordsPerBlock];
      ruleScanRecordBlocks.push_back(currentBlockPos);
      currentBlockEnd = currentBlockPos + numScanRecordsPerBlock;
    }
    return currentBlockPos++;
  }